

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int32_t zng_deflateReset(zng_stream *strm)

{
  int32_t iVar1;
  int ret;
  zng_stream *in_stack_ffffffffffffffe8;
  
  iVar1 = zng_deflateResetKeep(in_stack_ffffffffffffffe8);
  if (iVar1 == 0) {
    lm_init((deflate_state *)0x15655c);
  }
  return iVar1;
}

Assistant:

int32_t Z_EXPORT PREFIX(deflateReset)(PREFIX3(stream) *strm) {
    int ret = PREFIX(deflateResetKeep)(strm);
    if (ret == Z_OK)
        lm_init(strm->state);
    return ret;
}